

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O1

bool deqp::egl::anon_unknown_0::compareToReference
               (TestLog *log,char *name,char *description,Surface *reference,Surface *screen,int x,
               int y,int width,int height)

{
  bool bVar1;
  void *pvVar2;
  ConstPixelBufferAccess local_d0;
  ConstPixelBufferAccess local_a8;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  local_a8.m_format.order = RGBA;
  local_a8.m_format.type = UNORM_INT8;
  pvVar2 = (void *)(reference->m_pixels).m_cap;
  if (pvVar2 != (void *)0x0) {
    pvVar2 = (reference->m_pixels).m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_58,&local_a8.m_format,reference->m_width,reference->m_height,1,pvVar2);
  tcu::getSubregion(&local_a8,&local_58,x,y,width,height);
  local_d0.m_format.order = RGBA;
  local_d0.m_format.type = UNORM_INT8;
  pvVar2 = (void *)(screen->m_pixels).m_cap;
  if (pvVar2 != (void *)0x0) {
    pvVar2 = (screen->m_pixels).m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_80,&local_d0.m_format,screen->m_width,screen->m_height,1,pvVar2);
  tcu::getSubregion(&local_d0,&local_80,x,y,width,height);
  bVar1 = tcu::fuzzyCompare(log,name,description,&local_a8,&local_d0,0.05,COMPARE_LOG_RESULT);
  return bVar1;
}

Assistant:

bool compareToReference (tcu::TestLog& log, const char* name, const char* description, const tcu::Surface& reference, const tcu::Surface& screen, int x, int y, int width, int height)
{
	return tcu::fuzzyCompare(log, name, description,
							 getSubregion(reference.getAccess(), x, y, width, height),
							 getSubregion(screen.getAccess(), x, y, width, height),
							 0.05f, tcu::COMPARE_LOG_RESULT);
}